

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O3

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
google::protobuf::compiler::cpp::anon_unknown_4::Vars
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,FieldDescriptor *field,Options *opts)

{
  uint8_t uVar1;
  string *psVar2;
  Descriptor *extraout_RAX;
  Descriptor *pDVar3;
  anon_union_8_2_3066aaf9_for_type_descriptor_ *in_RCX;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  char *value;
  AlphaNum *in_R8;
  long lVar4;
  bool bVar5;
  initializer_list<google::protobuf::io::Printer::Sub> __l;
  string lazy_var;
  string trivial_default;
  allocator_type local_ac9;
  string local_ac8;
  undefined1 local_aa8 [32];
  undefined1 local_a88 [16];
  undefined1 local_a78 [32];
  string local_a58;
  string local_a38;
  string local_a18;
  string local_9f8;
  string local_9d8;
  string local_9b8;
  string local_998;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  undefined1 local_858 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_848 [2];
  anon_union_8_2_3066aaf9_for_type_descriptor_ local_828;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_820;
  anon_union_8_2_3066aaf9_for_type_descriptor_ local_818 [4];
  Descriptor *local_7f8;
  anon_union_8_2_3066aaf9_for_type_descriptor_ local_7f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7e8;
  anon_union_8_2_3066aaf9_for_type_descriptor_ local_7c0;
  char *local_7b8;
  undefined1 local_790 [88];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_738;
  undefined1 local_720 [64];
  bool local_6e0;
  AlphaNum local_6d8;
  Sub local_6a8;
  Sub local_5f0;
  Sub local_538;
  Sub local_480;
  Sub local_3c8;
  Sub local_310;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  if (opts->experimental_use_micro_string == true) {
    local_aa8._0_8_ = local_aa8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_aa8,"::absl::string_view()","");
    field_00 = extraout_RDX;
  }
  else {
    local_6a8.key_._M_dataplus._M_p = (pointer)0x2;
    local_6a8.key_._M_string_length = 0x12eb48f;
    bVar5 = opts->opensource_runtime != false;
    local_790._0_8_ = &DAT_00000006;
    if (bVar5) {
      local_790._0_8_ = &DAT_00000010;
    }
    local_790._8_8_ = "proto2";
    if (bVar5) {
      local_790._8_8_ = "google::protobuf";
    }
    in_RCX = &local_7f0;
    local_7f0 = (anon_union_8_2_3066aaf9_for_type_descriptor_)0x29;
    local_7e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x131bc4e;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_aa8,(lts_20250127 *)&local_6a8,(AlphaNum *)local_790,
               (AlphaNum *)in_RCX,in_R8);
    field_00 = extraout_RDX_00;
  }
  if (opts->experimental_use_micro_string == true) {
    local_6a8.key_._M_dataplus._M_p = &DAT_00000007;
    local_6a8.key_._M_string_length = 0x12eb5e8;
    MakeDefaultFieldName_abi_cxx11_((string *)local_a88,(cpp *)field,field_00);
    local_790._0_8_ = local_a88._8_8_;
    local_790._8_8_ = local_a88._0_8_;
    pDVar3 = (Descriptor *)local_a88._8_8_;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_ac8,(lts_20250127 *)&local_6a8,(AlphaNum *)local_790,
               (AlphaNum *)local_a88._8_8_);
  }
  else {
    QualifiedClassName_abi_cxx11_
              ((string *)local_a88,(cpp *)field->containing_type_,(Descriptor *)opts,
               (Options *)in_RCX);
    local_7f0.message_type = (Descriptor *)local_a88._8_8_;
    local_7e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a88._0_8_;
    local_7c0 = (anon_union_8_2_3066aaf9_for_type_descriptor_)0x2;
    local_7b8 = "::";
    MakeDefaultFieldName_abi_cxx11_((string *)&local_828,(cpp *)field,field_01);
    pDVar3 = (Descriptor *)local_858;
    local_858._0_8_ = local_820;
    local_858._8_8_ = local_828;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_ac8,(lts_20250127 *)&local_7f0,(AlphaNum *)&local_7c0,(AlphaNum *)pDVar3,in_R8
              );
    if ((anon_union_8_2_3066aaf9_for_type_descriptor_ *)local_828.message_type != local_818) {
      operator_delete(local_828.message_type,(ulong)&(local_818[0].message_type)->field_0x1);
    }
  }
  if ((AlphaNum *)local_a88._0_8_ != (AlphaNum *)local_a78) {
    operator_delete((void *)local_a88._0_8_,local_a78._0_8_ + 1);
  }
  psVar2 = ((field->field_20).default_value_enum_)->all_names_;
  uVar1 = field->type_;
  local_998._M_dataplus._M_p = (pointer)&local_998.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_998,"kDefault","");
  DefaultValue_abi_cxx11_(&local_878,(cpp *)opts,(Options *)field,(FieldDescriptor *)pDVar3);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_6a8,&local_998,&local_878);
  local_9b8._M_dataplus._M_p = (pointer)&local_9b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b8,"kDefaultLen","");
  local_7f8 = (Descriptor *)((field->field_20).default_value_enum_)->all_names_;
  io::Printer::Sub::Sub<unsigned_long>(&local_5f0,&local_9b8,(unsigned_long *)&local_7f8);
  local_9d8._M_dataplus._M_p = (pointer)&local_9d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d8,"default_variable_name","");
  local_790._0_8_ = &DAT_0000002e;
  local_790._8_8_ = "_i_give_permission_to_break_this_code_default_";
  FieldName_abi_cxx11_((string *)local_858,(cpp *)field,field_02);
  local_7f0 = (anon_union_8_2_3066aaf9_for_type_descriptor_)local_858._8_8_;
  local_7e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_858._0_8_;
  local_7c0 = (anon_union_8_2_3066aaf9_for_type_descriptor_)0x1;
  local_7b8 = "_";
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_898,(lts_20250127 *)local_790,(AlphaNum *)&local_7f0,(AlphaNum *)&local_7c0,
             in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_858 + 0x10)) {
    operator_delete((void *)local_858._0_8_,(ulong)(local_848[0]._M_allocated_capacity + 1));
  }
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_538,&local_9d8,&local_898);
  local_9f8._M_dataplus._M_p = (pointer)&local_9f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f8,"default_variable_field","");
  MakeDefaultFieldName_abi_cxx11_(&local_8b8,(cpp *)field,field_03);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_480,&local_9f8,&local_8b8);
  local_a18._M_dataplus._M_p = (pointer)&local_a18.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a18,"kDefaultStr","");
  if (psVar2 == (string *)0x0) {
    local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_938,local_aa8._0_8_,
               (pointer)((long)&((string_view *)local_aa8._8_8_)->_M_len + local_aa8._0_8_));
  }
  else {
    local_7f0.message_type = (Descriptor *)local_ac8._M_string_length;
    local_7e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ac8._M_dataplus._M_p;
    local_7c0.message_type = (Descriptor *)&DAT_00000006;
    local_7b8 = ".get()";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_938,(lts_20250127 *)&local_7f0,(AlphaNum *)&local_7c0,
               (AlphaNum *)local_ac8._M_string_length);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_3c8,&local_a18,&local_938);
  local_a38._M_dataplus._M_p = (pointer)&local_a38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a38,"kDefaultValue","");
  if (psVar2 == (string *)0x0) {
    local_858._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x1;
    local_858._8_8_ = "&";
    local_a88._0_8_ = local_aa8._8_8_;
    local_a88._8_8_ = local_aa8._0_8_;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_958,(lts_20250127 *)local_858,(AlphaNum *)local_a88,
               (AlphaNum *)local_aa8._8_8_);
  }
  else {
    local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_958,"nullptr","");
  }
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_310,&local_a38,&local_958);
  local_a58._M_dataplus._M_p = (pointer)&local_a58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a58,"lazy_var","");
  io::Printer::Sub::Sub<std::__cxx11::string&>(&local_258,&local_a58,&local_ac8);
  local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d8,"lazy_args","");
  if (psVar2 == (string *)0x0) {
    local_978._M_dataplus._M_p = (pointer)&local_978.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_978,anon_var_dwarf_a22956 + 5);
  }
  else {
    local_828.message_type = (Descriptor *)local_ac8._M_string_length;
    local_820 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ac8._M_dataplus._M_p;
    local_6d8.piece_._M_len = 1;
    local_6d8.piece_._M_str = ",";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_978,(lts_20250127 *)&local_828,&local_6d8,
               (AlphaNum *)local_ac8._M_string_length);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_790,&local_8d8,&local_978);
  local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f8,",","");
  io::Printer::Sub::WithSuffix(&local_1a0,(Sub *)local_790,&local_8f8);
  local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"byte","");
  value = "char";
  if (uVar1 == '\f') {
    value = "void";
  }
  io::Printer::Sub::Sub<char_const(&)[5]>(&local_e8,&local_918,(char (*) [5])value);
  __l._M_len = 9;
  __l._M_array = &local_6a8;
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  vector(__return_storage_ptr__,__l,&local_ac9);
  lVar4 = 0x678;
  do {
    if (local_6d8.digits_[lVar4 + 0x18] == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_720 + lVar4 + 0x30));
    }
    if ((long *)(local_720 + lVar4 + 0x18) != *(long **)(local_720 + lVar4 + 8)) {
      operator_delete(*(long **)(local_720 + lVar4 + 8),*(long *)(local_720 + lVar4 + 0x18) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[(byte)local_720[lVar4]]._M_data)
              ((anon_class_1_0_00000001 *)&local_ac9,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_790 + lVar4 + 0x50));
    local_720[lVar4] = 0xff;
    if ((long *)(local_790 + lVar4 + 0x40) != *(long **)(local_790 + lVar4 + 0x30)) {
      operator_delete(*(long **)(local_790 + lVar4 + 0x30),*(long *)(local_790 + lVar4 + 0x40) + 1);
    }
    lVar4 = lVar4 + -0xb8;
  } while (lVar4 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
    operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
  }
  if (local_6e0 == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)local_720)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._72_8_ != &local_738) {
    operator_delete((void *)local_790._72_8_,local_738._M_allocated_capacity + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_790[0x40]]._M_data)
            ((anon_class_1_0_00000001 *)&local_ac9,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)(local_790 + 0x20));
  local_790[0x40] = 0xff;
  if ((undefined1 *)local_790._0_8_ != local_790 + 0x10) {
    operator_delete((void *)local_790._0_8_,local_790._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_978._M_dataplus._M_p != &local_978.field_2) {
    operator_delete(local_978._M_dataplus._M_p,local_978.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_938._M_dataplus._M_p != &local_938.field_2) {
    operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
    operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
    operator_delete(local_8b8._M_dataplus._M_p,local_8b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f8._M_dataplus._M_p != &local_9f8.field_2) {
    operator_delete(local_9f8._M_dataplus._M_p,local_9f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898._M_dataplus._M_p != &local_898.field_2) {
    operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d8._M_dataplus._M_p != &local_9d8.field_2) {
    operator_delete(local_9d8._M_dataplus._M_p,local_9d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
    operator_delete(local_9b8._M_dataplus._M_p,local_9b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._M_dataplus._M_p != &local_878.field_2) {
    operator_delete(local_878._M_dataplus._M_p,local_878.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998._M_dataplus._M_p != &local_998.field_2) {
    operator_delete(local_998._M_dataplus._M_p,local_998.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
    operator_delete(local_ac8._M_dataplus._M_p,local_ac8.field_2._M_allocated_capacity + 1);
  }
  pDVar3 = (Descriptor *)(local_aa8 + 0x10);
  if ((Descriptor *)local_aa8._0_8_ != pDVar3) {
    operator_delete((void *)local_aa8._0_8_,local_aa8._16_8_ + 1);
    pDVar3 = extraout_RAX;
  }
  return (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
          *)pDVar3;
}

Assistant:

std::vector<Sub> Vars(const FieldDescriptor* field, const Options& opts) {
  auto trivial_default =
      opts.experimental_use_micro_string
          ? "::absl::string_view()"
          : absl::StrCat("::", ProtobufNamespace(opts),
                         "::internal::GetEmptyStringAlreadyInited()");
  auto lazy_var =
      opts.experimental_use_micro_string
          ? absl::StrCat("Impl_::", MakeDefaultFieldName(field))
          : absl::StrCat(QualifiedClassName(field->containing_type(), opts),
                         "::", MakeDefaultFieldName(field));

  bool empty_default = field->default_value_string().empty();
  bool bytes = field->type() == FieldDescriptor::TYPE_BYTES;

  return {
      {"kDefault", DefaultValue(opts, field)},
      {"kDefaultLen", field->default_value_string().size()},
      {"default_variable_name", MakeDefaultName(field)},
      {"default_variable_field", MakeDefaultFieldName(field)},

      {"kDefaultStr",
       !empty_default ? absl::StrCat(lazy_var, ".get()") : trivial_default},
      {"kDefaultValue",
       !empty_default ? "nullptr" : absl::StrCat("&", trivial_default)},

      {"lazy_var", lazy_var},
      Sub{"lazy_args", !empty_default ? absl::StrCat(lazy_var, ",") : ""}
          .WithSuffix(","),

      {"byte", bytes ? "void" : "char"},
  };
}